

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O0

uint_t flexfloat_pack(flexfloat_desc_t desc,_Bool sign,int_fast16_t exp,uint_t frac)

{
  int_fast16_t iVar1;
  int_fast16_t iVar2;
  long in_RCX;
  long in_RDX;
  byte in_SIL;
  flexfloat_desc_t in_DI;
  int_fast16_t inf_exp;
  int_fast16_t bias;
  undefined8 local_10;
  undefined1 uStack_1;
  
  iVar1 = flexfloat_bias(in_DI);
  iVar2 = flexfloat_inf_exp(in_DI);
  if (in_RDX == iVar2) {
    local_10 = 0x7ff;
  }
  else {
    local_10 = (in_RDX - iVar1) + 0x3ff;
  }
  uStack_1 = in_DI.frac_bits;
  return ((ulong)(in_SIL & 1) << 0x3f) + (local_10 << 0x34) + (in_RCX << (0x34 - uStack_1 & 0x3f));
}

Assistant:

uint_t flexfloat_pack(flexfloat_desc_t desc, bool sign, int_fast16_t exp, uint_t frac)
{
    int_fast16_t bias    = flexfloat_bias(desc);
    int_fast16_t inf_exp = flexfloat_inf_exp(desc);

    if(exp == inf_exp)   // Inf or NaN
    {
        exp = INF_EXP;
    }
    else
    {
        exp = (exp - bias) + BIAS;
    }
    return PACK(sign, exp, frac << (NUM_BITS_FRAC - desc.frac_bits));
}